

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

bool __thiscall CS248::StaticScene::Sphere::intersect(Sphere *this,Ray *r,Intersection *isect)

{
  Intersection *isect_local;
  Ray *r_local;
  Sphere *this_local;
  
  return false;
}

Assistant:

bool Sphere::intersect(const Ray& r, Intersection* isect) const {
  // TODO (PathTracer):
  // Implement ray - sphere intersection.
  // Note again that you might want to use the the Sphere::test helper here.
  // When an intersection takes place, the Intersection data should be updated
  // correspondingly.

  return false;
}